

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_a.cpp
# Opt level: O2

void msd_A(cacheblock_t *cache,size_t N,size_t cache_depth,size_t true_depth)

{
  undefined8 *puVar1;
  byte bVar2;
  byte bVar3;
  cacheblock_t *pcVar4;
  uchar *puVar5;
  void *__src;
  long lVar6;
  cacheblock_t *pcVar7;
  uint i;
  size_t sVar8;
  size_t __size;
  bool bVar9;
  size_t bucketsize [256];
  
  pcVar4 = cache;
  if (N < 0x20) {
    while (1 < (int)N) {
      N = (size_t)((int)N - 1);
      puVar5 = pcVar4[1].ptr;
      for (pcVar7 = pcVar4 + 1; cache < pcVar7; pcVar7 = pcVar7 + -1) {
        sVar8 = true_depth;
        while( true ) {
          bVar2 = pcVar7[-1].ptr[sVar8];
          bVar3 = puVar5[sVar8];
          if ((bVar2 == 0) || (bVar2 != bVar3)) break;
          sVar8 = sVar8 + 1;
        }
        if (bVar2 <= bVar3) break;
        pcVar7->ptr = pcVar7[-1].ptr;
      }
      pcVar7->ptr = puVar5;
      pcVar4 = pcVar4 + 1;
    }
  }
  else {
    if (3 < cache_depth) {
      fill_cache(cache,N,true_depth);
      cache_depth = 0;
    }
    memset(bucketsize,0,0x800);
    puVar5 = cache->bytes + cache_depth;
    sVar8 = N;
    while (bVar9 = sVar8 != 0, sVar8 = sVar8 - 1, bVar9) {
      bucketsize[*puVar5] = bucketsize[*puVar5] + 1;
      puVar5 = puVar5 + 0x10;
    }
    __size = N << 4;
    __src = malloc(__size);
    msd_A::bucketindex[0] = 0;
    sVar8 = 0;
    for (lVar6 = 0; lVar6 != 0xff; lVar6 = lVar6 + 1) {
      sVar8 = sVar8 + bucketsize[lVar6];
      msd_A::bucketindex[lVar6 + 1] = sVar8;
    }
    while (bVar9 = N != 0, N = N - 1, bVar9) {
      sVar8 = msd_A::bucketindex[pcVar4->bytes[cache_depth]];
      msd_A::bucketindex[pcVar4->bytes[cache_depth]] = sVar8 + 1;
      puVar5 = pcVar4->ptr;
      puVar1 = (undefined8 *)((long)__src + sVar8 * 0x10);
      *puVar1 = *(undefined8 *)pcVar4;
      puVar1[1] = puVar5;
      pcVar4 = pcVar4 + 1;
    }
    memcpy(cache,__src,__size);
    free(__src);
    for (lVar6 = 1; lVar6 != 0x100; lVar6 = lVar6 + 1) {
      sVar8 = bucketsize[lVar6];
      if (sVar8 != 0) {
        msd_A(cache + bucketsize[0],sVar8,cache_depth + 1,true_depth + 1);
        bucketsize[0] = bucketsize[0] + sVar8;
      }
    }
  }
  return;
}

Assistant:

static void
msd_A(cacheblock_t* cache, size_t N, size_t cache_depth, size_t true_depth)
{
	if (N < 32) {
		inssort_cache(cache, N, true_depth);
		return;
	}
	if (cache_depth >= CACHED_BYTES) {
		fill_cache(cache, N, true_depth);
		cache_depth = 0;
	}
	size_t bucketsize[256] = {0};
	for (size_t i=0; i < N; ++i)
		++bucketsize[cache[i].bytes[cache_depth]];
	cacheblock_t* sorted = (cacheblock_t*)
		malloc(N*sizeof(cacheblock_t));
	static size_t bucketindex[256];
	bucketindex[0] = 0;
	for (unsigned i=1; i < 256; ++i)
		bucketindex[i] = bucketindex[i-1] + bucketsize[i-1];
	for (size_t i=0; i < N; ++i)
		memcpy(&sorted[bucketindex[cache[i].bytes[cache_depth]]++],
				cache+i, sizeof(cacheblock_t));
	memcpy(cache, sorted, N*sizeof(cacheblock_t));
	free(sorted);
	size_t bsum = bucketsize[0];
	for (unsigned i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_A(cache+bsum, bucketsize[i],
			  cache_depth+1, true_depth+1);
		bsum += bucketsize[i];
	}
}